

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O2

_Bool has_test(TestSuite *suite,char *name)

{
  uint uVar1;
  UnitTest *pUVar2;
  _Bool _Var3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = suite->size;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  lVar5 = 0x10;
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pUVar2 = suite->tests;
    if (*(int *)((long)pUVar2 + lVar5 + -0x10) == 0) {
      iVar4 = strcmp(*(char **)((long)pUVar2 + lVar5 + -8),name);
      if (iVar4 == 0) break;
    }
    else {
      _Var3 = has_test(*(TestSuite **)((long)&pUVar2->type + lVar5),name);
      if (_Var3) break;
    }
    lVar5 = lVar5 + 0x18;
  }
  return (long)uVar6 < (long)(int)uVar1;
}

Assistant:

bool has_test(TestSuite *suite, const char *name) {
	int i;
	for (i = 0; i < suite->size; i++) {
        if (suite->tests[i].type == test_function) {
            if (strcmp(suite->tests[i].name, name) == 0) {
                return true;
            }
        } else if (has_test(suite->tests[i].Runnable.suite, name)) {
            return true;
        }
	}

	return false;
}